

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

BrotliDecoderErrorCode
DecodeContextMap(uint32_t context_map_size,uint32_t *num_htrees,uint8_t **context_map_arg,
                BrotliDecoderStateInternal *s)

{
  uint32_t *puVar1;
  byte bVar2;
  byte *pbVar3;
  uint32_t uVar4;
  int iVar5;
  uint uVar6;
  BrotliRunningContextMapState BVar7;
  uint8_t *puVar8;
  ulong uVar9;
  HuffmanCode *pHVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint unaff_EBP;
  BrotliBitReader *br;
  uint uVar13;
  BrotliDecoderErrorCode BVar14;
  uint64_t uVar15;
  size_t sVar16;
  ulong unaff_R12;
  ulong uVar17;
  bool bVar18;
  bool bVar19;
  uint32_t code;
  uint local_4c;
  uint32_t local_48;
  uint local_44;
  BrotliBitReader *local_40;
  uint8_t **local_38;
  
  if (BROTLI_STATE_CONTEXT_MAP_TRANSFORM < s->substate_context_map) {
    return BROTLI_DECODER_ERROR_UNREACHABLE;
  }
  br = &s->br;
  switch(s->substate_context_map) {
  case BROTLI_STATE_CONTEXT_MAP_NONE:
    BVar14 = DecodeVarLenUint8(s,br,num_htrees);
    if (BVar14 != BROTLI_DECODER_SUCCESS) {
      return BVar14;
    }
    *num_htrees = *num_htrees + 1;
    s->context_index = 0;
    unaff_R12 = (ulong)context_map_size;
    puVar8 = (uint8_t *)(*s->alloc_func)(s->memory_manager_opaque,unaff_R12);
    *context_map_arg = puVar8;
    if (puVar8 == (uint8_t *)0x0) {
      return BROTLI_DECODER_ERROR_ALLOC_CONTEXT_MAP;
    }
    if (*num_htrees < 2) {
      memset(puVar8,0,unaff_R12);
      return BROTLI_DECODER_SUCCESS;
    }
    s->substate_context_map = BROTLI_STATE_CONTEXT_MAP_READ_PREFIX;
    break;
  case BROTLI_STATE_CONTEXT_MAP_HUFFMAN:
    goto switchD_00103711_caseD_2;
  case BROTLI_STATE_CONTEXT_MAP_DECODE:
    goto switchD_00103711_caseD_3;
  case BROTLI_STATE_CONTEXT_MAP_TRANSFORM:
    goto switchD_00103711_caseD_4;
  }
  uVar11 = (s->br).bit_pos_;
  bVar19 = uVar11 - 0x3c < 5;
  if (bVar19) {
    sVar16 = (s->br).avail_in;
    if (sVar16 != 0) {
      uVar17 = (s->br).val_;
      pbVar3 = (s->br).next_in;
      (s->br).val_ = uVar17 >> 8;
      (s->br).val_ = (ulong)*pbVar3 << 0x38 | uVar17 >> 8;
      uVar11 = uVar11 - 8;
      (s->br).bit_pos_ = uVar11;
      (s->br).avail_in = sVar16 - 1;
      (s->br).next_in = pbVar3 + 1;
      bVar19 = false;
      goto LAB_001037e6;
    }
    uVar6 = 0;
  }
  else {
LAB_001037e6:
    uVar6 = (uint)(br->val_ >> ((byte)uVar11 & 0x3f)) & 0x1f;
  }
  if (bVar19) {
    return BROTLI_DECODER_NEEDS_MORE_INPUT;
  }
  s->max_run_length_prefix = (uVar6 >> 1) + 1 & -(uVar6 & 1);
  (s->br).bit_pos_ = (s->br).bit_pos_ + (uVar6 & 1) * 4 + 1;
  s->substate_context_map = BROTLI_STATE_CONTEXT_MAP_HUFFMAN;
switchD_00103711_caseD_2:
  BVar14 = ReadHuffmanCode(s->max_run_length_prefix + *num_htrees,s->context_map_table,
                           (uint32_t *)0x0,s);
  if (BVar14 != BROTLI_DECODER_SUCCESS) {
    return BVar14;
  }
  s->code = 0xffff;
  s->substate_context_map = BROTLI_STATE_CONTEXT_MAP_DECODE;
  unaff_EBP = context_map_size;
switchD_00103711_caseD_3:
  uVar6 = s->context_index;
  uVar17 = (ulong)uVar6;
  uVar11 = s->max_run_length_prefix;
  puVar8 = *context_map_arg;
  local_4c = s->code;
  BVar14 = BROTLI_DECODER_NEEDS_MORE_INPUT;
  local_38 = context_map_arg;
  if (local_4c == 0xffff) goto LAB_001039a0;
LAB_0010389c:
  uVar6 = (uint)uVar17;
  uVar12 = (s->br).bit_pos_;
  bVar19 = 0x40 - uVar12 < local_4c;
  if (bVar19) {
    sVar16 = (s->br).avail_in;
    if (sVar16 != 0) {
      uVar15 = (s->br).val_;
      uVar13 = 0x48 - uVar12;
      pbVar3 = (s->br).next_in;
      do {
        uVar12 = uVar12 - 8;
        sVar16 = sVar16 - 1;
        (s->br).val_ = uVar15 >> 8;
        uVar15 = (ulong)*pbVar3 << 0x38 | uVar15 >> 8;
        (s->br).val_ = uVar15;
        (s->br).bit_pos_ = uVar12;
        (s->br).avail_in = sVar16;
        (s->br).next_in = pbVar3 + 1;
        bVar19 = uVar13 < local_4c;
        if (!bVar19) goto LAB_00103936;
        uVar13 = uVar13 + 8;
        pbVar3 = pbVar3 + 1;
      } while (sVar16 != 0);
    }
  }
  else {
LAB_00103936:
    unaff_EBP = (uint)((s->br).val_ >> ((byte)uVar12 & 0x3f)) & kBitMask[local_4c];
    (s->br).bit_pos_ = uVar12 + local_4c;
  }
  if (bVar19) {
    s->code = local_4c;
    s->context_index = uVar6;
    BVar14 = BROTLI_DECODER_NEEDS_MORE_INPUT;
    bVar19 = false;
  }
  else {
    unaff_EBP = unaff_EBP + (1 << ((byte)local_4c & 0x1f));
    bVar19 = false;
    if (context_map_size < uVar6 + unaff_EBP) {
      BVar14 = BROTLI_DECODER_ERROR_FORMAT_CONTEXT_MAP_REPEAT;
    }
    else {
      do {
        uVar9 = uVar17 & 0xffffffff;
        uVar6 = (int)uVar17 + 1;
        uVar17 = (ulong)uVar6;
        puVar8[uVar9] = '\0';
        unaff_EBP = unaff_EBP - 1;
      } while (unaff_EBP != 0);
      unaff_EBP = 0;
      bVar19 = true;
    }
  }
  if (bVar19) {
LAB_001039a0:
    bVar19 = true;
    if (uVar6 < context_map_size) {
      uVar17 = (ulong)uVar6;
      do {
        uVar12 = (s->br).bit_pos_;
        bVar19 = uVar12 - 0x32 < 0xf;
        if (bVar19) {
          sVar16 = (s->br).avail_in;
          if (sVar16 != 0) {
            uVar15 = (s->br).val_;
            pbVar3 = (s->br).next_in;
            uVar4 = uVar12;
            do {
              uVar12 = uVar4 - 8;
              sVar16 = sVar16 - 1;
              (s->br).val_ = uVar15 >> 8;
              uVar15 = (ulong)*pbVar3 << 0x38 | uVar15 >> 8;
              (s->br).val_ = uVar15;
              (s->br).bit_pos_ = uVar12;
              (s->br).avail_in = sVar16;
              (s->br).next_in = pbVar3 + 1;
              bVar19 = uVar4 - 0x3a < 0xf;
              if (!bVar19) goto LAB_00103a1a;
              pbVar3 = pbVar3 + 1;
              uVar4 = uVar12;
            } while (sVar16 != 0);
          }
        }
        else {
LAB_00103a1a:
          unaff_R12 = (ulong)((uint)(br->val_ >> ((byte)uVar12 & 0x3f)) & 0x7fff);
        }
        if (bVar19) {
          local_48 = uVar11;
          local_44 = context_map_size;
          local_40 = br;
          iVar5 = SafeDecodeSymbol(s->context_map_table,br,&local_4c);
          br = local_40;
          context_map_size = local_44;
          uVar11 = local_48;
          if (iVar5 == 0) {
            s->code = 0xffff;
            s->context_index = (uint32_t)uVar17;
            BVar14 = BROTLI_DECODER_NEEDS_MORE_INPUT;
            goto LAB_00103aea;
          }
        }
        else {
          pHVar10 = s->context_map_table + (unaff_R12 & 0xff);
          bVar2 = pHVar10->bits;
          if (8 < bVar2) {
            puVar1 = &(s->br).bit_pos_;
            *puVar1 = *puVar1 + 8;
            pHVar10 = pHVar10 + (ulong)pHVar10->value +
                                (ulong)((uint)(unaff_R12 >> 8) & 0xffffff & kBitMask[bVar2 - 8]);
          }
          puVar1 = &(s->br).bit_pos_;
          *puVar1 = *puVar1 + (uint)pHVar10->bits;
          local_4c = (uint)pHVar10->value;
        }
        if (local_4c == 0) {
          iVar5 = 0;
        }
        else {
          iVar5 = local_4c - uVar11;
          if (local_4c < uVar11 || iVar5 == 0) goto LAB_0010389c;
        }
        puVar8[uVar17] = (uint8_t)iVar5;
        uVar17 = uVar17 + 1;
        if ((uint)uVar17 == context_map_size) {
          bVar19 = true;
          break;
        }
      } while( true );
    }
  }
  else {
LAB_00103aea:
    bVar19 = false;
  }
  context_map_arg = local_38;
  if (!bVar19) {
    return BVar14;
  }
switchD_00103711_caseD_4:
  uVar6 = (s->br).bit_pos_;
  bVar19 = uVar6 == 0x40;
  if (bVar19) {
    sVar16 = (s->br).avail_in;
    if (sVar16 == 0) {
      bVar18 = false;
      goto LAB_00103b5b;
    }
    uVar17 = (s->br).val_;
    pbVar3 = (s->br).next_in;
    (s->br).val_ = uVar17 >> 8;
    (s->br).val_ = (ulong)*pbVar3 << 0x38 | uVar17 >> 8;
    uVar6 = 0x38;
    (s->br).bit_pos_ = 0x38;
    (s->br).avail_in = sVar16 - 1;
    (s->br).next_in = pbVar3 + 1;
    bVar19 = false;
  }
  (s->br).bit_pos_ = uVar6 + 1;
  bVar18 = ((s->br).val_ >> ((ulong)uVar6 & 0x3f) & 1) == 0;
LAB_00103b5b:
  BVar7 = (uint)bVar19 * 4;
  BVar14 = (uint)bVar19 + BROTLI_DECODER_SUCCESS;
  if ((bVar19 == false) && (!bVar18)) {
    InverseMoveToFrontTransform(*context_map_arg,context_map_size,s);
    BVar14 = BROTLI_DECODER_SUCCESS;
    BVar7 = BROTLI_STATE_CONTEXT_MAP_NONE;
  }
  s->substate_context_map = BVar7;
  return BVar14;
}

Assistant:

static BrotliDecoderErrorCode DecodeContextMap(uint32_t context_map_size,
                                               uint32_t* num_htrees,
                                               uint8_t** context_map_arg,
                                               BrotliDecoderState* s) {
  BrotliBitReader* br = &s->br;
  BrotliDecoderErrorCode result = BROTLI_DECODER_SUCCESS;

  switch ((int)s->substate_context_map) {
    case BROTLI_STATE_CONTEXT_MAP_NONE:
      result = DecodeVarLenUint8(s, br, num_htrees);
      if (result != BROTLI_DECODER_SUCCESS) {
        return result;
      }
      (*num_htrees)++;
      s->context_index = 0;
      BROTLI_LOG_UINT(context_map_size);
      BROTLI_LOG_UINT(*num_htrees);
      *context_map_arg = (uint8_t*)BROTLI_ALLOC(s, (size_t)context_map_size);
      if (*context_map_arg == 0) {
        return BROTLI_FAILURE(BROTLI_DECODER_ERROR_ALLOC_CONTEXT_MAP);
      }
      if (*num_htrees <= 1) {
        memset(*context_map_arg, 0, (size_t)context_map_size);
        return BROTLI_DECODER_SUCCESS;
      }
      s->substate_context_map = BROTLI_STATE_CONTEXT_MAP_READ_PREFIX;
      /* No break, continue to next state. */
    case BROTLI_STATE_CONTEXT_MAP_READ_PREFIX: {
      uint32_t bits;
      /* In next stage ReadHuffmanCode uses at least 4 bits, so it is safe
         to peek 4 bits ahead. */
      if (!BrotliSafeGetBits(br, 5, &bits)) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if ((bits & 1) != 0) { /* Use RLE for zeros. */
        s->max_run_length_prefix = (bits >> 1) + 1;
        BrotliDropBits(br, 5);
      } else {
        s->max_run_length_prefix = 0;
        BrotliDropBits(br, 1);
      }
      BROTLI_LOG_UINT(s->max_run_length_prefix);
      s->substate_context_map = BROTLI_STATE_CONTEXT_MAP_HUFFMAN;
      /* No break, continue to next state. */
    }
    case BROTLI_STATE_CONTEXT_MAP_HUFFMAN:
      result = ReadHuffmanCode(*num_htrees + s->max_run_length_prefix,
                               s->context_map_table, NULL, s);
      if (result != BROTLI_DECODER_SUCCESS) return result;
      s->code = 0xFFFF;
      s->substate_context_map = BROTLI_STATE_CONTEXT_MAP_DECODE;
      /* No break, continue to next state. */
    case BROTLI_STATE_CONTEXT_MAP_DECODE: {
      uint32_t context_index = s->context_index;
      uint32_t max_run_length_prefix = s->max_run_length_prefix;
      uint8_t* context_map = *context_map_arg;
      uint32_t code = s->code;
      if (code != 0xFFFF) {
        goto rleCode;
      }
      while (context_index < context_map_size) {
        if (!SafeReadSymbol(s->context_map_table, br, &code)) {
          s->code = 0xFFFF;
          s->context_index = context_index;
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        BROTLI_LOG_UINT(code);

        if (code == 0) {
          context_map[context_index++] = 0;
          continue;
        }
        if (code > max_run_length_prefix) {
          context_map[context_index++] =
              (uint8_t)(code - max_run_length_prefix);
          continue;
        }
rleCode:
        {
          uint32_t reps;
          if (!BrotliSafeReadBits(br, code, &reps)) {
            s->code = code;
            s->context_index = context_index;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          reps += 1U << code;
          BROTLI_LOG_UINT(reps);
          if (context_index + reps > context_map_size) {
            return
                BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_CONTEXT_MAP_REPEAT);
          }
          do {
            context_map[context_index++] = 0;
          } while (--reps);
        }
      }
      /* No break, continue to next state. */
    }
    case BROTLI_STATE_CONTEXT_MAP_TRANSFORM: {
      uint32_t bits;
      if (!BrotliSafeReadBits(br, 1, &bits)) {
        s->substate_context_map = BROTLI_STATE_CONTEXT_MAP_TRANSFORM;
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if (bits != 0) {
        InverseMoveToFrontTransform(*context_map_arg, context_map_size, s);
      }
      s->substate_context_map = BROTLI_STATE_CONTEXT_MAP_NONE;
      return BROTLI_DECODER_SUCCESS;
    }
    default:
      return
          BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE);
  }
}